

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_fma.cpp
# Opt level: O0

int __thiscall ncnn::Convolution_x86_fma::create_pipeline(Convolution_x86_fma *this,Option *opt)

{
  long lVar1;
  int *piVar2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  Layer *pLVar7;
  void **ppvVar8;
  undefined8 *puVar9;
  long *plVar10;
  Option *in_RSI;
  long *in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  Mat *in_stack_00000008;
  Mat *in_stack_00000010;
  int in_stack_00000020;
  int in_stack_00000024;
  int in_stack_00000028;
  int in_stack_0000002c;
  int in_stack_00000030;
  int in_stack_00000034;
  Mat *in_stack_00000038;
  Mat *in_stack_00000040;
  bool prefer_sgemm_2;
  bool prefer_sgemm_1;
  bool prefer_sgemm;
  int out_elempack;
  int elempack;
  Mat weights_1 [1];
  Mat *in_stack_000001c8;
  Mat *in_stack_000001d0;
  Mat weights [2];
  ParamDict pd;
  int num_input;
  int kernel_size;
  int in_stack_00000398;
  int in_stack_0000039c;
  int in_stack_000003a0;
  int in_stack_000003a4;
  Mat *in_stack_000003a8;
  Mat *in_stack_000003b0;
  undefined4 in_stack_fffffffffffffb70;
  undefined4 in_stack_fffffffffffffb74;
  int in_stack_fffffffffffffb7c;
  Mat *in_stack_fffffffffffffb88;
  long *plVar11;
  ParamDict *in_stack_fffffffffffffb90;
  long *plVar12;
  undefined4 in_stack_fffffffffffffba8;
  undefined4 in_stack_fffffffffffffbac;
  Convolution_x86_fma *in_stack_fffffffffffffbb0;
  undefined8 *local_410;
  Option *in_stack_fffffffffffffc20;
  Mat *in_stack_fffffffffffffc28;
  int in_stack_fffffffffffffc34;
  void **local_398;
  void **local_350;
  int local_330;
  int local_32c;
  undefined1 local_328 [8];
  int in_stack_fffffffffffffce0;
  int in_stack_fffffffffffffce4;
  undefined4 in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcec;
  void *__ptr;
  int iVar13;
  Mat *in_stack_fffffffffffffcf0;
  Mat *in_stack_fffffffffffffcf8;
  long *local_2f8;
  undefined8 uStack_2d0;
  undefined1 local_2c8 [16];
  void *local_2b8;
  int *local_2b0;
  void *local_2a8;
  undefined4 local_2a0;
  long *local_298;
  undefined4 local_290;
  undefined4 local_28c;
  undefined4 local_288;
  undefined4 local_284;
  undefined4 local_280;
  void *local_278;
  void *local_270;
  int *local_268;
  undefined8 local_260;
  undefined4 local_258;
  long *local_250;
  undefined4 local_248;
  undefined4 local_244;
  undefined4 local_240;
  undefined4 local_23c;
  undefined4 local_238;
  undefined8 local_230;
  void *apvStack_228 [2];
  int in_stack_fffffffffffffde8;
  int in_stack_fffffffffffffdec;
  int in_stack_fffffffffffffdf0;
  int in_stack_fffffffffffffdf4;
  Mat *in_stack_fffffffffffffdf8;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  int iVar14;
  Mat *in_stack_fffffffffffffe20;
  Option *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  Mat *in_stack_fffffffffffffe50;
  Mat *in_stack_fffffffffffffe58;
  Option *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  Mat *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec8;
  int in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  Mat *in_stack_ffffffffffffff18;
  Option *in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  Mat *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  Option *in_stack_fffffffffffffff8;
  
  __ptr = (void *)CONCAT44(in_stack_fffffffffffffcec,in_stack_fffffffffffffce8);
  if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x158) == 0) {
    plVar10 = in_RDI;
    pLVar7 = create_activation_layer
                       (in_stack_fffffffffffffc34,in_stack_fffffffffffffc28,
                        in_stack_fffffffffffffc20);
    iVar13 = (int)((ulong)__ptr >> 0x20);
    iVar14 = (int)__ptr;
    in_RDI[1] = (long)pLVar7;
    if (((in_RSI->use_int8_inference & 1U) == 0) ||
       (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x170) != 1)) {
      iVar5 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
              *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
      uVar4 = (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) / (long)iVar5;
      iVar6 = (int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
                   (long)*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
      if ((((in_RSI->use_packing_layout & 1U) == 0) &&
          (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) ==
             *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) &&
            (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1)) &&
           (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) ==
            *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc))))) &&
         ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
          (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
        pLVar7 = create_layer(in_stack_fffffffffffffb7c);
        in_RDI[0x2f] = (long)pLVar7;
        ParamDict::ParamDict(in_stack_fffffffffffffb90);
        ParamDict::set((ParamDict *)&stack0xfffffffffffffdf0,0,
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0));
        ParamDict::set((ParamDict *)&stack0xfffffffffffffdf0,1,
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4));
        ParamDict::set((ParamDict *)&stack0xfffffffffffffdf0,0xb,
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8));
        ParamDict::set((ParamDict *)&stack0xfffffffffffffdf0,2,1);
        ParamDict::set((ParamDict *)&stack0xfffffffffffffdf0,0xc,1);
        ParamDict::set((ParamDict *)&stack0xfffffffffffffdf0,3,1);
        ParamDict::set((ParamDict *)&stack0xfffffffffffffdf0,0xd,1);
        ParamDict::set((ParamDict *)&stack0xfffffffffffffdf0,4,0);
        ParamDict::set((ParamDict *)&stack0xfffffffffffffdf0,0xe,0);
        ParamDict::set((ParamDict *)&stack0xfffffffffffffdf0,5,
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100));
        ParamDict::set((ParamDict *)&stack0xfffffffffffffdf0,6,
                       *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104));
        (**(code **)(*(long *)in_RDI[0x2f] + 0x10))((long *)in_RDI[0x2f],&stack0xfffffffffffffdf0);
        if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100) == 0) {
          puVar9 = (undefined8 *)&stack0xfffffffffffffce8;
          do {
            *puVar9 = 0;
            puVar9[1] = 0;
            puVar9[2] = 0;
            *(undefined4 *)(puVar9 + 3) = 0;
            puVar9[4] = 0;
            *(undefined4 *)(puVar9 + 5) = 0;
            *(undefined4 *)((long)puVar9 + 0x2c) = 0;
            *(undefined4 *)(puVar9 + 6) = 0;
            *(undefined4 *)((long)puVar9 + 0x34) = 0;
            *(undefined4 *)(puVar9 + 7) = 0;
            puVar9[8] = 0;
            puVar9 = puVar9 + 9;
          } while (puVar9 != &uStack_2d0);
          lVar1 = *(long *)(*in_RDI + -0x18);
          if (&stack0xfffffffffffffce8 != (undefined1 *)((long)in_RDI + lVar1 + 0x160)) {
            if (*(long *)((long)in_RDI + lVar1 + 0x168) != 0) {
              piVar2 = *(int **)((long)in_RDI + lVar1 + 0x168);
              LOCK();
              *piVar2 = *piVar2 + 1;
              UNLOCK();
            }
            if (in_stack_fffffffffffffcf0 != (Mat *)0x0) {
              LOCK();
              iVar14 = *(int *)&in_stack_fffffffffffffcf0->data;
              *(int *)&in_stack_fffffffffffffcf0->data =
                   *(int *)&in_stack_fffffffffffffcf0->data + -1;
              UNLOCK();
              if (iVar14 == 1) {
                if (local_2f8 == (long *)0x0) {
                  if (__ptr != (void *)0x0) {
                    free(__ptr);
                  }
                }
                else {
                  (**(code **)(*local_2f8 + 0x18))(local_2f8,__ptr);
                }
              }
            }
          }
          plVar10 = (long *)in_RDI[0x2f];
          ModelBinFromMatArray::ModelBinFromMatArray
                    ((ModelBinFromMatArray *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          (**(code **)(*plVar10 + 0x18))(plVar10,local_328);
          ModelBinFromMatArray::~ModelBinFromMatArray
                    ((ModelBinFromMatArray *)
                     CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
          local_410 = &uStack_2d0;
          do {
            puVar9 = local_410 + -9;
            if (local_410[-8] != 0) {
              piVar2 = (int *)local_410[-8];
              LOCK();
              iVar14 = *piVar2;
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (iVar14 == 1) {
                if (local_410[-5] == 0) {
                  if ((void *)*puVar9 != (void *)0x0) {
                    free((void *)*puVar9);
                  }
                }
                else {
                  (**(code **)(*(long *)local_410[-5] + 0x18))((long *)local_410[-5],*puVar9);
                }
              }
            }
            *puVar9 = 0;
            local_410[-7] = 0;
            *(undefined4 *)(local_410 + -6) = 0;
            *(undefined4 *)(local_410 + -4) = 0;
            *(undefined4 *)((long)local_410 + -0x1c) = 0;
            *(undefined4 *)(local_410 + -3) = 0;
            *(undefined4 *)((long)local_410 + -0x14) = 0;
            *(undefined4 *)(local_410 + -2) = 0;
            local_410[-1] = 0;
            local_410[-8] = 0;
            local_410 = puVar9;
          } while (puVar9 != (undefined8 *)&stack0xfffffffffffffce8);
        }
        else {
          local_350 = &local_2b8;
          do {
            *local_350 = (void *)0x0;
            local_350[1] = (void *)0x0;
            local_350[2] = (void *)0x0;
            *(undefined4 *)(local_350 + 3) = 0;
            local_350[4] = (void *)0x0;
            *(undefined4 *)(local_350 + 5) = 0;
            *(undefined4 *)((long)local_350 + 0x2c) = 0;
            *(undefined4 *)(local_350 + 6) = 0;
            *(undefined4 *)((long)local_350 + 0x34) = 0;
            *(undefined4 *)(local_350 + 7) = 0;
            local_350[8] = (void *)0x0;
            local_350 = local_350 + 9;
          } while (local_350 != apvStack_228);
          lVar1 = *(long *)(*in_RDI + -0x18);
          ppvVar8 = (void **)((long)in_RDI + lVar1 + 0x160);
          if (&local_2b8 != ppvVar8) {
            if (*(long *)((long)in_RDI + lVar1 + 0x168) != 0) {
              piVar2 = *(int **)((long)in_RDI + lVar1 + 0x168);
              LOCK();
              *piVar2 = *piVar2 + 1;
              UNLOCK();
            }
            if (local_2b0 != (int *)0x0) {
              LOCK();
              iVar14 = *local_2b0;
              *local_2b0 = *local_2b0 + -1;
              UNLOCK();
              if (iVar14 == 1) {
                if (local_298 == (long *)0x0) {
                  if (local_2b8 != (void *)0x0) {
                    free(local_2b8);
                  }
                }
                else {
                  (**(code **)(*local_298 + 0x18))(local_298,local_2b8);
                }
              }
            }
            local_2b8 = *ppvVar8;
            local_2b0 = (int *)ppvVar8[1];
            local_2a8 = ppvVar8[2];
            local_2a0 = *(undefined4 *)(ppvVar8 + 3);
            local_298 = (long *)ppvVar8[4];
            local_290 = *(undefined4 *)(ppvVar8 + 5);
            local_28c = *(undefined4 *)((long)ppvVar8 + 0x2c);
            local_288 = *(undefined4 *)(ppvVar8 + 6);
            local_284 = *(undefined4 *)((long)ppvVar8 + 0x34);
            local_280 = *(undefined4 *)(ppvVar8 + 7);
            local_278 = ppvVar8[8];
          }
          lVar1 = *(long *)(*in_RDI + -0x18);
          ppvVar8 = (void **)((long)in_RDI + lVar1 + 0x1a8);
          if (&local_270 != ppvVar8) {
            if (*(long *)((long)in_RDI + lVar1 + 0x1b0) != 0) {
              piVar2 = *(int **)((long)in_RDI + lVar1 + 0x1b0);
              LOCK();
              *piVar2 = *piVar2 + 1;
              UNLOCK();
            }
            if (local_268 != (int *)0x0) {
              LOCK();
              iVar14 = *local_268;
              *local_268 = *local_268 + -1;
              UNLOCK();
              if (iVar14 == 1) {
                if (local_250 == (long *)0x0) {
                  if (local_270 != (void *)0x0) {
                    free(local_270);
                  }
                }
                else {
                  (**(code **)(*local_250 + 0x18))(local_250,local_270);
                }
              }
            }
            local_270 = *ppvVar8;
            local_268 = *(int **)((long)in_RDI + lVar1 + 0x1b0);
            local_260 = *(undefined8 *)((long)in_RDI + lVar1 + 0x1b8);
            local_258 = *(undefined4 *)((long)in_RDI + lVar1 + 0x1c0);
            local_250 = *(long **)((long)in_RDI + lVar1 + 0x1c8);
            local_248 = *(undefined4 *)((long)in_RDI + lVar1 + 0x1d0);
            local_244 = *(undefined4 *)((long)in_RDI + lVar1 + 0x1d4);
            local_240 = *(undefined4 *)((long)in_RDI + lVar1 + 0x1d8);
            local_23c = *(undefined4 *)((long)in_RDI + lVar1 + 0x1dc);
            local_238 = *(undefined4 *)((long)in_RDI + lVar1 + 0x1e0);
            local_230 = *(undefined8 *)((long)in_RDI + lVar1 + 0x1e8);
          }
          plVar10 = (long *)in_RDI[0x2f];
          ModelBinFromMatArray::ModelBinFromMatArray
                    ((ModelBinFromMatArray *)in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
          (**(code **)(*plVar10 + 0x18))(plVar10,local_2c8);
          ModelBinFromMatArray::~ModelBinFromMatArray
                    ((ModelBinFromMatArray *)
                     CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
          local_398 = apvStack_228;
          do {
            ppvVar8 = local_398 + -9;
            if (local_398[-8] != (void *)0x0) {
              piVar2 = (int *)local_398[-8];
              LOCK();
              iVar14 = *piVar2;
              *piVar2 = *piVar2 + -1;
              UNLOCK();
              if (iVar14 == 1) {
                if (local_398[-5] == (void *)0x0) {
                  if (*ppvVar8 != (void *)0x0) {
                    free(*ppvVar8);
                  }
                }
                else {
                  (**(code **)(*local_398[-5] + 0x18))(local_398[-5],*ppvVar8);
                }
              }
            }
            *ppvVar8 = (void *)0x0;
            local_398[-7] = (void *)0x0;
            *(undefined4 *)(local_398 + -6) = 0;
            *(undefined4 *)(local_398 + -4) = 0;
            *(undefined4 *)((long)local_398 + -0x1c) = 0;
            *(undefined4 *)(local_398 + -3) = 0;
            *(undefined4 *)((long)local_398 + -0x14) = 0;
            *(undefined4 *)(local_398 + -2) = 0;
            local_398[-1] = (void *)0x0;
            local_398[-8] = (void *)0x0;
            local_398 = ppvVar8;
          } while (ppvVar8 != &local_2b8);
        }
        (**(code **)(*(long *)in_RDI[0x2f] + 0x20))((long *)in_RDI[0x2f],in_RSI);
        if ((in_RSI->lightmode & 1U) != 0) {
          lVar1 = *(long *)(*in_RDI + -0x18);
          puVar9 = (undefined8 *)((long)in_RDI + lVar1 + 0x160);
          if (*(long *)((long)in_RDI + lVar1 + 0x168) != 0) {
            piVar2 = *(int **)((long)in_RDI + lVar1 + 0x168);
            LOCK();
            iVar14 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (iVar14 == 1) {
              if (*(long *)((long)in_RDI + lVar1 + 0x180) == 0) {
                if ((void *)*puVar9 != (void *)0x0) {
                  free((void *)*puVar9);
                }
              }
              else {
                plVar10 = *(long **)((long)in_RDI + lVar1 + 0x180);
                (**(code **)(*plVar10 + 0x18))(plVar10,*puVar9);
              }
            }
          }
          *puVar9 = 0;
          puVar9[2] = 0;
          *(undefined4 *)(puVar9 + 3) = 0;
          *(undefined4 *)(puVar9 + 5) = 0;
          *(undefined4 *)((long)puVar9 + 0x2c) = 0;
          *(undefined4 *)(puVar9 + 6) = 0;
          *(undefined4 *)((long)puVar9 + 0x34) = 0;
          *(undefined4 *)(puVar9 + 7) = 0;
          puVar9[8] = 0;
          puVar9[1] = 0;
        }
        iVar14 = 0;
        ParamDict::~ParamDict
                  ((ParamDict *)CONCAT44(in_stack_fffffffffffffb74,in_stack_fffffffffffffb70));
      }
      else {
        local_32c = 1;
        local_330 = 1;
        if ((in_RSI->use_packing_layout & 1U) != 0) {
          if (iVar6 % 8 == 0) {
            local_32c = 8;
          }
          else {
            local_32c = 1;
            if (iVar6 % 4 == 0) {
              local_32c = 4;
            }
          }
          if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) {
            local_330 = 8;
          }
          else {
            local_330 = 1;
            if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) {
              local_330 = 4;
            }
          }
        }
        if ((local_32c == 8) && (local_330 == 8)) {
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)))) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
            convolution_im2col_sgemm_transform_kernel_pack8_avx
                      (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                       in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))) {
            convolution_im2col_sgemm_transform_kernel_pack8_avx
                      (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                       in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
          }
          else if (((in_RSI->use_winograd_convolution & 1U) == 0) ||
                  (((((((in_RSI->use_winograd23_convolution & 1U) == 0 &&
                       ((in_RSI->use_winograd43_convolution & 1U) == 0)) &&
                      ((in_RSI->use_winograd63_convolution & 1U) == 0)) ||
                     ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) != 3 ||
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) != 3)))) ||
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1 ||
                     ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1 ||
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 1)))))) ||
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 1 ||
                    ((iVar6 < 9 && (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 9))
                    )))))) {
            if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3 &&
                  (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                 (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)))) &&
               ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
              convolution_transform_kernel_packed_sse
                        (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                         in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,
                         in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
            }
            else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 2) &&
                    (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 2 &&
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                     ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                      ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
                       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))))) {
              convolution_transform_kernel_packed_sse
                        (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                         in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,
                         in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
            }
            else if ((in_RSI->use_sgemm_convolution & 1U) == 0) {
              convolution_transform_kernel_packed_sse
                        (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                         in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,
                         in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
            }
            else {
              convolution_im2col_sgemm_transform_kernel_pack8_avx
                        (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                         in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
            }
          }
          else if ((((((in_RSI->use_winograd63_convolution & 1U) == 0) || (iVar6 < 0x10)) ||
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 0x10)) ||
                   ((0x40 < iVar6 ||
                    (0x40 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0))))) &&
                  (((in_RSI->use_winograd43_convolution & 1U) != 0 ||
                   ((in_RSI->use_winograd23_convolution & 1U) != 0)))) {
            if (((((in_RSI->use_winograd43_convolution & 1U) == 0) || (iVar6 < 0x10)) ||
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 0x10)) &&
               (((in_RSI->use_winograd63_convolution & 1U) != 0 ||
                ((in_RSI->use_winograd23_convolution & 1U) != 0)))) {
              conv3x3s1_winograd23_transform_kernel_pack8_avx
                        (in_stack_fffffffffffffe20,
                         (Mat *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         (int)((ulong)plVar10 >> 0x20),(int)plVar10,in_RSI);
            }
            else {
              conv3x3s1_winograd43_transform_kernel_pack8_avx
                        (in_stack_fffffffffffffe50,
                         (Mat *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                         in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,
                         in_stack_fffffffffffffe38);
            }
          }
          else {
            conv3x3s1_winograd63_transform_kernel_pack8_avx
                      ((Mat *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       in_stack_fffffffffffffe78,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                       (int)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          }
        }
        iVar13 = (int)((ulong)__ptr >> 0x20);
        iVar14 = (int)__ptr;
        if ((local_32c == 4) && (local_330 == 8)) {
          if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
             ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)) &&
              ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))) {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx
                      (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                       in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))) {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx
                      (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                       in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
          }
          else if ((in_RSI->use_sgemm_convolution & 1U) == 0) {
            convolution_transform_kernel_packed_sse
                      (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                       in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,in_stack_fffffffffffffec0
                       ,in_stack_fffffffffffffec8);
          }
          else {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx
                      (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                       in_stack_fffffffffffffce4,in_stack_fffffffffffffce0);
          }
        }
        iVar13 = (int)((ulong)__ptr >> 0x20);
        iVar14 = (int)__ptr;
        if ((local_32c == 1) && (local_330 == 8)) {
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)))) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx
                      (in_stack_00000038,(Mat *)CONCAT44(in_stack_00000034,in_stack_00000030),
                       in_stack_0000002c,in_stack_00000028,in_stack_00000024,in_stack_00000020);
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))) {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx
                      (in_stack_00000038,(Mat *)CONCAT44(in_stack_00000034,in_stack_00000030),
                       in_stack_0000002c,in_stack_00000028,in_stack_00000024,in_stack_00000020);
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                  ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))) {
            convolution_transform_kernel_packed_sse
                      (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                       in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,in_stack_fffffffffffffec0
                       ,in_stack_fffffffffffffec8);
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)))) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            convolution_transform_kernel_packed_sse
                      (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                       in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,in_stack_fffffffffffffec0
                       ,in_stack_fffffffffffffec8);
          }
          else if ((in_RSI->use_sgemm_convolution & 1U) == 0) {
            convolution_transform_kernel_packed_sse
                      (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                       in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,in_stack_fffffffffffffec0
                       ,in_stack_fffffffffffffec8);
          }
          else {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx
                      (in_stack_00000038,(Mat *)CONCAT44(in_stack_00000034,in_stack_00000030),
                       in_stack_0000002c,in_stack_00000028,in_stack_00000024,in_stack_00000020);
          }
        }
        if ((local_32c == 8) && (local_330 == 4)) {
          if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
             ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)) &&
              ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))) {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx
                      ((Mat *)CONCAT44(iVar5,iVar6),in_stack_fffffffffffffdf8,
                       in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec
                       ,in_stack_fffffffffffffde8);
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))) {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx
                      ((Mat *)CONCAT44(iVar5,iVar6),in_stack_fffffffffffffdf8,
                       in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec
                       ,in_stack_fffffffffffffde8);
          }
          else if ((in_RSI->use_sgemm_convolution & 1U) == 0) {
            convolution_transform_kernel_packed_sse
                      (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                       (int)((ulong)__ptr >> 0x20),(int)__ptr,in_stack_fffffffffffffce4,
                       in_stack_fffffffffffffce0,in_stack_fffffffffffffec0,in_stack_fffffffffffffec8
                      );
          }
          else {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx
                      ((Mat *)CONCAT44(iVar5,iVar6),in_stack_fffffffffffffdf8,
                       in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec
                       ,in_stack_fffffffffffffde8);
          }
        }
        iVar14 = (int)((ulong)__ptr >> 0x20);
        if ((local_32c == 8) && (local_330 == 1)) {
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)))) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx
                      ((Mat *)CONCAT44(iVar5,iVar6),in_stack_fffffffffffffdf8,
                       in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec
                       ,in_stack_fffffffffffffde8);
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))) {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx
                      ((Mat *)CONCAT44(iVar5,iVar6),in_stack_fffffffffffffdf8,
                       in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec
                       ,in_stack_fffffffffffffde8);
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                   (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)))) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
            if (((in_RSI->use_winograd_convolution & 1U) == 0) ||
               ((in_RSI->use_winograd63_convolution & 1U) == 0)) {
              convolution_transform_kernel_packed_sse
                        (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar14,(int)__ptr,
                         in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,
                         in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
            }
            else {
              conv3x3s1_winograd63_transform_kernel_pack8to1_avx
                        ((Mat *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                         in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                         in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
            }
          }
          else if ((in_RSI->use_sgemm_convolution & 1U) == 0) {
            convolution_transform_kernel_packed_sse
                      (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar14,(int)__ptr,
                       in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,in_stack_fffffffffffffec0
                       ,in_stack_fffffffffffffec8);
          }
          else {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx
                      ((Mat *)CONCAT44(iVar5,iVar6),in_stack_fffffffffffffdf8,
                       in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec
                       ,in_stack_fffffffffffffde8);
          }
        }
        if ((local_32c == 4) && (local_330 == 4)) {
          iVar14 = (int)in_stack_ffffffffffffff08;
          iVar13 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
          if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
             ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)) &&
              ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))) {
            convolution_im2col_sgemm_transform_kernel_pack4_sse
                      (in_stack_ffffffffffffff18,
                       (Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),iVar13,
                       iVar14,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))) {
            convolution_im2col_sgemm_transform_kernel_pack4_sse
                      (in_stack_ffffffffffffff18,
                       (Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),iVar13,
                       iVar14,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
          }
          else if ((((in_RSI->use_winograd_convolution & 1U) == 0) ||
                   ((((in_RSI->use_winograd23_convolution & 1U) == 0 &&
                     ((in_RSI->use_winograd43_convolution & 1U) == 0)) &&
                    ((in_RSI->use_winograd63_convolution & 1U) == 0)))) ||
                  ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) != 3 ||
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) != 3)) ||
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1 ||
                     ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1 ||
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 1)))))) ||
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 1)))) {
            if ((((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1) ||
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1)) ||
                  (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 1)) ||
                 ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 1 ||
                  ((bVar3 = true, iVar6 < 0xc &&
                   (bVar3 = true, *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 0xc))
                  )))) && (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1 ||
                            ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1 ||
                             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) < 2 &&
                              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) < 2))))))
                           || ((bVar3 = true, iVar6 < 0x10 &&
                               (bVar3 = true,
                               *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 0x10))))
                          )) &&
               (((1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) ||
                 (bVar3 = false, 1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0))) &&
                (bVar3 = true, iVar6 < 0x10)))) {
              bVar3 = 0xf < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            }
            if (((in_RSI->use_sgemm_convolution & 1U) == 0) || (!bVar3)) {
              convolution_transform_kernel_packed_sse
                        (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                         (int)((ulong)__ptr >> 0x20),(int)__ptr,in_stack_fffffffffffffce4,
                         in_stack_fffffffffffffce0,in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffec8);
            }
            else {
              convolution_im2col_sgemm_transform_kernel_pack4_sse
                        (in_stack_ffffffffffffff18,
                         (Mat *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),iVar13
                         ,iVar14,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
            }
          }
          else if (((((in_RSI->use_winograd63_convolution & 1U) == 0) || (iVar6 < 8)) ||
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 8 ||
                    ((0x20 < iVar6 ||
                     (0x20 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0))))))) &&
                  (((in_RSI->use_winograd43_convolution & 1U) != 0 ||
                   ((in_RSI->use_winograd23_convolution & 1U) != 0)))) {
            if (((((in_RSI->use_winograd43_convolution & 1U) == 0) || (iVar6 < 8)) ||
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 8)) &&
               (((in_RSI->use_winograd63_convolution & 1U) != 0 ||
                ((in_RSI->use_winograd23_convolution & 1U) != 0)))) {
              conv3x3s1_winograd23_transform_kernel_pack4_sse
                        (in_stack_fffffffffffffe20,
                         (Mat *)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18),
                         (int)((ulong)plVar10 >> 0x20),(int)plVar10,in_RSI);
            }
            else {
              conv3x3s1_winograd43_transform_kernel_pack4_sse
                        (in_stack_fffffffffffffe50,
                         (Mat *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                         in_stack_fffffffffffffe44,in_stack_fffffffffffffe40,
                         in_stack_fffffffffffffe38);
            }
          }
          else {
            conv3x3s1_winograd63_transform_kernel_pack4_sse
                      ((Mat *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       in_stack_fffffffffffffe78,(int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                       (int)in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
          }
        }
        iVar13 = (int)((ulong)__ptr >> 0x20);
        iVar14 = (int)__ptr;
        if ((local_32c == 1) && (local_330 == 4)) {
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)))) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse
                      (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c
                       ,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                       in_stack_fffffffffffffe40);
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))) {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse
                      (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c
                       ,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
                       in_stack_fffffffffffffe40);
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                  ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))))) {
            convolution_transform_kernel_packed_sse
                      (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                       in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,in_stack_fffffffffffffec0
                       ,in_stack_fffffffffffffec8);
          }
          else if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 3) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 3 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)))) &&
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))) {
            convolution_transform_kernel_packed_sse
                      (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                       in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,in_stack_fffffffffffffec0
                       ,in_stack_fffffffffffffec8);
          }
          else {
            if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1) ||
                 ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1 ||
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 1)) ||
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 1)) ||
                  ((bVar3 = true, iVar6 < 0xc &&
                   (bVar3 = true, *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 0xc))
                  )))) && ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1 ||
                           (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1 ||
                             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) < 2 &&
                              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) < 2)))) ||
                            ((bVar3 = true, iVar6 < 0x10 &&
                             (bVar3 = true,
                             *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 0x10))))))
                          )) &&
               (((1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) ||
                 (bVar3 = false, 1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0))) &&
                (bVar3 = true, iVar6 < 0x10)))) {
              bVar3 = 0xf < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            }
            if (((in_RSI->use_sgemm_convolution & 1U) == 0) || (!bVar3)) {
              convolution_transform_kernel_packed_sse
                        (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,iVar13,iVar14,
                         in_stack_fffffffffffffce4,in_stack_fffffffffffffce0,
                         in_stack_fffffffffffffec0,in_stack_fffffffffffffec8);
            }
            else {
              convolution_im2col_sgemm_transform_kernel_pack1to4_sse
                        (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                         in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48,
                         in_stack_fffffffffffffe44,in_stack_fffffffffffffe40);
            }
          }
        }
        if ((local_32c == 4) && (local_330 == 1)) {
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)))) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse
                      ((Mat *)CONCAT44(iVar5,iVar6),in_stack_fffffffffffffdf8,
                       in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec
                       ,in_stack_fffffffffffffde8);
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))) {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse
                      ((Mat *)CONCAT44(iVar5,iVar6),in_stack_fffffffffffffdf8,
                       in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec
                       ,in_stack_fffffffffffffde8);
          }
          else if (((in_RSI->use_winograd_convolution & 1U) == 0) ||
                  (((((((in_RSI->use_winograd63_convolution & 1U) == 0 ||
                       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) != 3)) ||
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) != 3)) ||
                     ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1 ||
                      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1)))) ||
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 1)) ||
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 1)))) {
            if ((((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1) ||
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1)) ||
                  ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 1 ||
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 1)))) ||
                 ((bVar3 = true, iVar6 < 0xc &&
                  (bVar3 = true, *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 0xc)))
                 ) && (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1 ||
                        ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1 ||
                         ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) < 2 &&
                          (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) < 2)))))) ||
                       ((bVar3 = true, iVar6 < 0x10 &&
                        (bVar3 = true,
                        *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 0x10)))))) &&
               (((1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) ||
                 (bVar3 = false, 1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0))) &&
                (bVar3 = true, iVar6 < 0x10)))) {
              bVar3 = 0xf < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            }
            if (((in_RSI->use_sgemm_convolution & 1U) == 0) || (!bVar3)) {
              convolution_transform_kernel_packed_sse
                        (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,
                         (int)((ulong)__ptr >> 0x20),(int)__ptr,in_stack_fffffffffffffce4,
                         in_stack_fffffffffffffce0,in_stack_fffffffffffffec0,
                         in_stack_fffffffffffffec8);
            }
            else {
              convolution_im2col_sgemm_transform_kernel_pack4to1_sse
                        ((Mat *)CONCAT44(iVar5,iVar6),in_stack_fffffffffffffdf8,
                         in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffdec,in_stack_fffffffffffffde8);
            }
          }
          else {
            conv3x3s1_winograd63_transform_kernel_pack4to1_sse
                      (in_stack_000001d0,in_stack_000001c8,weights_1[0].cstep._4_4_,
                       (int)weights_1[0].cstep,(Option *)weights_1[0]._56_8_);
          }
        }
        if ((local_32c == 1) && (local_330 == 1)) {
          if (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
              (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
               (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1)))) &&
             ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 1 &&
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 1)))) {
            convolution_im2col_sgemm_transform_kernel_sse
                      (in_stack_000003b0,in_stack_000003a8,in_stack_000003a4,in_stack_000003a0,
                       in_stack_0000039c,in_stack_00000398);
          }
          else if ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 1) &&
                  (((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) == 1 &&
                    (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) == 1)) &&
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) == 1 &&
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 2 &&
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 2)))))))) {
            convolution_im2col_sgemm_transform_kernel_sse
                      (in_stack_000003b0,in_stack_000003a8,in_stack_000003a4,in_stack_000003a0,
                       in_stack_0000039c,in_stack_00000398);
          }
          else if (((in_RSI->use_winograd_convolution & 1U) == 0) ||
                  ((((((in_RSI->use_winograd23_convolution & 1U) == 0 &&
                      ((in_RSI->use_winograd43_convolution & 1U) == 0)) ||
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) != 3)) ||
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) != 3 ||
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) != 1)))) ||
                   ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) != 1 ||
                    ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) != 1 ||
                     (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) != 1)))))))) {
            if ((in_RSI->use_sgemm_convolution & 1U) == 0) {
              lVar1 = *(long *)(*in_RDI + -0x18);
              plVar10 = (long *)((long)in_RDI + lVar1 + 0x160);
              plVar11 = in_RDI + 2;
              if (plVar11 != plVar10) {
                if (*(long *)((long)in_RDI + lVar1 + 0x168) != 0) {
                  piVar2 = *(int **)((long)in_RDI + lVar1 + 0x168);
                  LOCK();
                  *piVar2 = *piVar2 + 1;
                  UNLOCK();
                }
                plVar12 = plVar11;
                if (in_RDI[3] != 0) {
                  piVar2 = (int *)in_RDI[3];
                  LOCK();
                  iVar14 = *piVar2;
                  *piVar2 = *piVar2 + -1;
                  UNLOCK();
                  if (iVar14 == 1) {
                    if (in_RDI[6] == 0) {
                      if ((void *)*plVar11 != (void *)0x0) {
                        free((void *)*plVar11);
                      }
                    }
                    else {
                      (**(code **)(*(long *)in_RDI[6] + 0x18))((long *)in_RDI[6],*plVar11);
                    }
                  }
                }
                *plVar11 = 0;
                plVar11[2] = 0;
                *(undefined4 *)(plVar11 + 3) = 0;
                *(undefined4 *)(plVar11 + 5) = 0;
                *(undefined4 *)((long)plVar11 + 0x2c) = 0;
                *(undefined4 *)(plVar11 + 6) = 0;
                *(undefined4 *)((long)plVar11 + 0x34) = 0;
                *(undefined4 *)(plVar11 + 7) = 0;
                plVar11[8] = 0;
                plVar11[1] = 0;
                *plVar12 = *plVar10;
                plVar12[1] = plVar10[1];
                plVar12[2] = plVar10[2];
                *(int *)(plVar12 + 3) = (int)plVar10[3];
                plVar12[4] = plVar10[4];
                *(int *)(plVar12 + 5) = (int)plVar10[5];
                *(undefined4 *)((long)plVar12 + 0x2c) = *(undefined4 *)((long)plVar10 + 0x2c);
                *(int *)(plVar12 + 6) = (int)plVar10[6];
                *(undefined4 *)((long)plVar12 + 0x34) = *(undefined4 *)((long)plVar10 + 0x34);
                *(int *)(plVar12 + 7) = (int)plVar10[7];
                plVar12[8] = plVar10[8];
              }
            }
            else {
              convolution_im2col_sgemm_transform_kernel_sse
                        (in_stack_000003b0,in_stack_000003a8,in_stack_000003a4,in_stack_000003a0,
                         in_stack_0000039c,in_stack_00000398);
            }
          }
          else if (((((in_RSI->use_winograd43_convolution & 1U) == 0) || (iVar6 < 0x10)) ||
                   (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) < 0x10)) &&
                  ((in_RSI->use_winograd23_convolution & 1U) != 0)) {
            conv3x3s1_winograd23_transform_kernel_sse
                      (in_stack_00000010,in_stack_00000008,unaff_retaddr_00,unaff_retaddr,
                       in_stack_fffffffffffffff8);
          }
          else {
            conv3x3s1_winograd43_transform_kernel_sse
                      (in_stack_00000040,in_stack_00000038,in_stack_00000034,in_stack_00000030,
                       (Option *)CONCAT44(in_stack_0000002c,in_stack_00000028));
          }
        }
        if ((in_RSI->lightmode & 1U) != 0) {
          lVar1 = *(long *)(*in_RDI + -0x18);
          puVar9 = (undefined8 *)((long)in_RDI + lVar1 + 0x160);
          if (*(long *)((long)in_RDI + lVar1 + 0x168) != 0) {
            piVar2 = *(int **)((long)in_RDI + lVar1 + 0x168);
            LOCK();
            iVar14 = *piVar2;
            *piVar2 = *piVar2 + -1;
            UNLOCK();
            if (iVar14 == 1) {
              if (*(long *)((long)in_RDI + lVar1 + 0x180) == 0) {
                if ((void *)*puVar9 != (void *)0x0) {
                  free((void *)*puVar9);
                }
              }
              else {
                plVar10 = *(long **)((long)in_RDI + lVar1 + 0x180);
                (**(code **)(*plVar10 + 0x18))(plVar10,*puVar9);
              }
            }
          }
          *puVar9 = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x170) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x178) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x188) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x18c) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 400) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x194) = 0;
          *(undefined4 *)((long)in_RDI + lVar1 + 0x198) = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x1a0) = 0;
          *(undefined8 *)((long)in_RDI + lVar1 + 0x168) = 0;
        }
        iVar14 = 0;
      }
    }
    else {
      iVar14 = create_pipeline_int8_x86
                         (in_stack_fffffffffffffbb0,
                          (Option *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
    }
  }
  else {
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

int Convolution_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    activation = create_activation_layer(activation_type, activation_params, opt);

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    int kernel_size = kernel_w * kernel_h;
    int num_input = weight_data_size / kernel_size / num_output;

    if (!opt.use_packing_layout && kernel_w == kernel_h && dilation_w != 1 && dilation_h == dilation_w && stride_w == 1 && stride_h == 1)
    {
        convolution_dilation1 = ncnn::create_layer(ncnn::LayerType::Convolution);

        // set param
        ncnn::ParamDict pd;
        pd.set(0, num_output); // num_output
        pd.set(1, kernel_w);
        pd.set(11, kernel_h);
        pd.set(2, 1);
        pd.set(12, 1);
        pd.set(3, 1);  // stride_w
        pd.set(13, 1); // stride_h
        pd.set(4, 0);  // pad_w
        pd.set(14, 0); // pad_h
        pd.set(5, bias_term);
        pd.set(6, weight_data_size);

        convolution_dilation1->load_param(pd);

        // set weights
        if (bias_term)
        {
            ncnn::Mat weights[2];
            weights[0] = weight_data;
            weights[1] = bias_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }
        else
        {
            ncnn::Mat weights[1];
            weights[0] = weight_data;

            convolution_dilation1->load_model(ModelBinFromMatArray(weights));
        }

        convolution_dilation1->create_pipeline(opt);

        if (opt.lightmode)
        {
            weight_data.release();
        }

        return 0;
    }

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 32 && num_output >= 32 && num_input <= 128 && num_output <= 128) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack16_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 32 && num_output >= 32) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack16_avx512(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack16_avx512(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 8 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to8_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 4 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to4_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 1 && out_elempack == 16)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to16_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    if (elempack == 16 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack16to1_avx512(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack16to1_avx512(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

#endif // __AVX512F__

    // pack8
    if (elempack == 8 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input > 8 || num_output > 8))
        {
            if ((opt.use_winograd63_convolution && num_input >= 16 && num_output >= 16 && num_input <= 64 && num_output <= 64) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack8_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack8_avx(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack8_avx(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 2 && kernel_h == 2 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack4to8
    if (elempack == 4 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack1to8
    if (elempack == 1 && out_elempack == 8)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to8_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to4
    if (elempack == 8 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to4_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }

    // pack8to1
    if (elempack == 8 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if (opt.use_winograd_convolution && opt.use_winograd63_convolution)
            {
                conv3x3s1_winograd63_transform_kernel_pack8to1_avx(weight_data, weight_winograd63_data, num_input, num_output, opt);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_pack8to1_avx(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
    }
#endif // __AVX__

    // pack4
    if (elempack == 4 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution || opt.use_winograd63_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd63_convolution && num_input >= 8 && num_output >= 8 && num_input <= 32 && num_output <= 32) || (!opt.use_winograd43_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd63_transform_kernel_pack4_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
            else if ((opt.use_winograd43_convolution && num_input >= 8 && num_output >= 8) || (!opt.use_winograd63_convolution && !opt.use_winograd23_convolution))
                conv3x3s1_winograd43_transform_kernel_pack4_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            else // if (opt.use_winograd23_convolution)
                conv3x3s1_winograd23_transform_kernel_pack4_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack1to4
    if (elempack == 1 && out_elempack == 4)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else if (kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack1to4_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }

    // pack4to1
    if (elempack == 4 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && opt.use_winograd63_convolution && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            conv3x3s1_winograd63_transform_kernel_pack4to1_sse(weight_data, weight_winograd63_data, num_input, num_output, opt);
        }
        else
        {
            bool prefer_sgemm = (dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1 && (num_input >= 12 || num_output >= 12))
                                || (dilation_w == 1 && dilation_h == 1 && (stride_w >= 2 || stride_h >= 2) && (num_input >= 16 || num_output >= 16))
                                || ((dilation_w >= 2 || dilation_h >= 2) && (num_input >= 16 || num_output >= 16));

            if (opt.use_sgemm_convolution && prefer_sgemm)
            {
                convolution_im2col_sgemm_transform_kernel_pack4to1_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
            }
            else
            {
                convolution_transform_kernel_packed_sse(weight_data, weight_data_tm, num_input, num_output, kernel_w, kernel_h, elempack, out_elempack);
            }
        }
    }
#endif // __SSE2__

    // pack1
    if (elempack == 1 && out_elempack == 1)
    {
        if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (kernel_w == 1 && kernel_h == 1 && dilation_w == 1 && dilation_h == 1 && stride_w == 2 && stride_h == 2)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else if (opt.use_winograd_convolution && (opt.use_winograd23_convolution || opt.use_winograd43_convolution) && kernel_w == 3 && kernel_h == 3 && dilation_w == 1 && dilation_h == 1 && stride_w == 1 && stride_h == 1)
        {
            if ((opt.use_winograd43_convolution && num_input >= 16 && num_output >= 16) || !opt.use_winograd23_convolution)
            {
                conv3x3s1_winograd43_transform_kernel_sse(weight_data, weight_winograd43_data, num_input, num_output, opt);
            }
            else
            {
                conv3x3s1_winograd23_transform_kernel_sse(weight_data, weight_winograd23_data, num_input, num_output, opt);
            }
        }
        else if (opt.use_sgemm_convolution)
        {
            convolution_im2col_sgemm_transform_kernel_sse(weight_data, weight_sgemm_data, num_input, num_output, kernel_w, kernel_h);
        }
        else
        {
            weight_data_tm = weight_data;
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}